

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_0::IsImplicitLod(Op opcode)

{
  if (((6 < opcode - OpImageSampleImplicitLod) ||
      ((0x55U >> (opcode - OpImageSampleImplicitLod & 0x1f) & 1) == 0)) &&
     ((6 < opcode - OpImageSparseSampleImplicitLod ||
      ((0x55U >> (opcode - OpImageSparseSampleImplicitLod & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool IsImplicitLod(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
      return true;
    default:
      break;
  }
  return false;
}